

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_sort.cpp
# Opt level: O0

void duckdb::ListSortFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  LogicalTypeId LVar1;
  bool bVar2;
  byte bVar3;
  unsigned_short uVar4;
  uint uVar5;
  LogicalType *pLVar6;
  type pSVar7;
  vector *pvVar8;
  idx_t iVar9;
  reference pvVar10;
  ulong uVar11;
  Vector *in_RDX;
  DataChunk *in_RDI;
  uint64_t b;
  idx_t j;
  idx_t i_2;
  list_entry_t *result_data_2;
  Vector *result_entry;
  idx_t i_1;
  idx_t row_count;
  uint *result_data_1;
  Vector result_vector;
  DataChunk result_chunk;
  PayloadScanner scanner;
  idx_t sel_sorted_idx;
  SelectionVector sel_sorted;
  list_entry_t *result_data;
  uint64_t source_idx;
  idx_t child_idx;
  list_entry_t *list_entry;
  idx_t lists_index;
  idx_t i;
  bool data_to_sort;
  uint32_t incr_payload_count;
  idx_t offset_lists_indices;
  SelectionVector sel;
  uint *payload_vector_data;
  Vector payload_vector;
  unsigned_short *lists_indices_data;
  Vector lists_indices;
  list_entry_t *list_entries;
  UnifiedVectorFormat lists_data;
  Vector *child_vector;
  idx_t lists_size;
  Vector sort_result_vec;
  LocalSortState local_sort_state;
  GlobalSortState global_sort_state;
  BufferManager *buffer_manager;
  ListSortBindData *info;
  BoundFunctionExpression *func_expr;
  ValidityMask *result_validity;
  Vector *input_lists;
  idx_t count;
  LocalSortState *in_stack_fffffffffffff7b8;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffff7c0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffff7c8;
  undefined7 in_stack_fffffffffffff7d0;
  undefined1 in_stack_fffffffffffff7d7;
  idx_t in_stack_fffffffffffff7d8;
  SelectionVector *in_stack_fffffffffffff7e0;
  Value *pVVar12;
  BaseExpression *in_stack_fffffffffffff800;
  Value local_798 [64];
  long local_758;
  Value *local_750;
  UnifiedVectorFormat *local_748;
  list_entry_t *local_740;
  Vector *in_stack_fffffffffffff8c8;
  ulong uVar13;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff8d0;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffff8d8;
  idx_t in_stack_fffffffffffff8e0;
  SelectionVector *in_stack_fffffffffffff8e8;
  Vector *in_stack_fffffffffffff8f0;
  LocalSortState *in_stack_fffffffffffff900;
  bool *in_stack_fffffffffffff908;
  Vector *in_stack_fffffffffffff910;
  DataChunk local_6a8 [64];
  PayloadScanner local_668 [24];
  long local_650;
  SelectionVector local_648;
  list_entry_t *local_630;
  long local_628;
  ulong local_620;
  list_entry_t *local_618;
  idx_t local_610;
  UnifiedVectorFormat *local_608;
  TemplatedValidityMask<unsigned_long> local_5fd;
  uint *local_5d8;
  LogicalType local_5d0 [24];
  Vector local_5b8 [104];
  unsigned_short *local_550;
  LogicalType local_548 [24];
  TemplatedValidityMask<unsigned_long> local_530 [3];
  list_entry_t *local_4c8;
  SelectionVector *local_4c0 [9];
  SelectionVector *local_478;
  ulong local_470;
  byte local_461;
  LogicalType local_460 [24];
  Vector local_448 [120];
  LocalSortState local_3d0 [208];
  GlobalSortState local_300 [696];
  undefined8 local_48;
  ListSortBindData *local_40;
  BoundFunctionExpression *local_38;
  ValidityMask *local_30;
  reference local_28;
  UnifiedVectorFormat *local_20;
  Vector *local_18;
  
  local_18 = in_RDX;
  local_20 = (UnifiedVectorFormat *)DataChunk::size(in_RDI);
  local_28 = vector<duckdb::Vector,_true>::operator[]
                       ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff7c0,
                        (size_type)in_stack_fffffffffffff7b8);
  duckdb::Vector::SetVectorType((VectorType)local_18);
  local_30 = FlatVector::Validity((Vector *)0xd56cb9);
  pLVar6 = Vector::GetType(local_28);
  LVar1 = LogicalType::id(pLVar6);
  if (LVar1 == SQLNULL) {
    TemplatedValidityMask<unsigned_long>::SetInvalid
              (in_stack_fffffffffffff7c0,(idx_t)in_stack_fffffffffffff7b8);
  }
  else {
    local_38 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(in_stack_fffffffffffff800);
    unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::operator->
              ((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
               in_stack_fffffffffffff7c0);
    local_40 = FunctionData::Cast<duckdb::ListSortBindData>
                         ((FunctionData *)in_stack_fffffffffffff7c0);
    local_48 = duckdb::BufferManager::GetBufferManager(local_40->context);
    duckdb::GlobalSortState::GlobalSortState
              (local_300,local_40->context,(vector *)&local_40->orders,&local_40->payload_layout);
    duckdb::LocalSortState::LocalSortState(local_3d0);
    duckdb::LocalSortState::Initialize((GlobalSortState *)local_3d0,(BufferManager *)local_300);
    local_461 = 0;
    if ((local_40->is_grade_up & 1U) == 0) {
      duckdb::Vector::Vector(local_448,local_18);
    }
    else {
      pLVar6 = Vector::GetType(local_28);
      duckdb::LogicalType::LogicalType(local_460,pLVar6);
      local_461 = 1;
      duckdb::Vector::Vector(local_448,local_460,0x800);
    }
    if ((local_461 & 1) != 0) {
      duckdb::LogicalType::~LogicalType(local_460);
    }
    duckdb::VectorOperations::Copy(local_28,local_448,(ulong)local_20,0,0);
    local_470 = duckdb::ListVector::GetListSize(local_448);
    local_478 = (SelectionVector *)duckdb::ListVector::GetEntry(local_448);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4c0);
    duckdb::Vector::ToUnifiedFormat((ulong)local_448,local_20);
    local_4c8 = UnifiedVectorFormat::GetData<duckdb::list_entry_t>((UnifiedVectorFormat *)local_4c0)
    ;
    duckdb::LogicalType::LogicalType(local_548,USMALLINT);
    duckdb::Vector::Vector((Vector *)local_530,local_548,0x800);
    duckdb::LogicalType::~LogicalType(local_548);
    local_550 = FlatVector::GetData<unsigned_short>((Vector *)0xd56f2b);
    duckdb::LogicalType::LogicalType(local_5d0,UINTEGER);
    duckdb::Vector::Vector(local_5b8,local_5d0,0x800);
    duckdb::LogicalType::~LogicalType(local_5d0);
    local_5d8 = FlatVector::GetData<unsigned_int>((Vector *)0xd56f8f);
    SelectionVector::SelectionVector(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
    local_5fd._5_8_ = 0;
    local_5fd.validity_mask._1_4_ = 0;
    local_5fd.validity_mask._0_1_ = 0;
    for (local_608 = (UnifiedVectorFormat *)0x0; local_608 < local_20; local_608 = local_608 + 1) {
      local_610 = SelectionVector::get_index(local_4c0[0],(idx_t)local_608);
      local_618 = local_4c8 + local_610;
      bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_fffffffffffff7c8,(idx_t)in_stack_fffffffffffff7c0);
      if (bVar2) {
        if (local_618->length != 0) {
          for (local_620 = 0; local_620 < local_618->length; local_620 = local_620 + 1) {
            if (local_5fd._5_8_ == 0x800) {
              in_stack_fffffffffffff7c8 = local_530;
              in_stack_fffffffffffff7c0 = &local_5fd;
              in_stack_fffffffffffff7b8 = local_3d0;
              SinkDataChunk(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                            in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8,
                            in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                            in_stack_fffffffffffff900,in_stack_fffffffffffff908,
                            in_stack_fffffffffffff910);
              local_5fd._5_8_ = 0;
            }
            local_628 = local_618->offset + local_620;
            SelectionVector::set_index
                      ((SelectionVector *)
                       CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                       (idx_t)in_stack_fffffffffffff7c8,(idx_t)in_stack_fffffffffffff7c0);
            uVar4 = UnsafeNumericCast<unsigned_short,unsigned_long,void>((unsigned_long)local_608);
            local_550[local_5fd._5_8_] = uVar4;
            uVar5 = NumericCast<unsigned_int,unsigned_long,void>(0xd572e3);
            local_5d8[local_5fd._5_8_] = uVar5;
            local_5fd._5_8_ = local_5fd._5_8_ + 1;
            local_5fd.validity_mask._1_4_ = local_5fd.validity_mask._1_4_ + 1;
          }
        }
      }
      else {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (in_stack_fffffffffffff7c0,(idx_t)in_stack_fffffffffffff7b8);
      }
    }
    if (local_5fd._5_8_ != 0) {
      in_stack_fffffffffffff7c8 = local_530;
      in_stack_fffffffffffff7c0 = &local_5fd;
      in_stack_fffffffffffff7b8 = local_3d0;
      SinkDataChunk(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0,
                    in_stack_fffffffffffff8d8,in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
                    in_stack_fffffffffffff900,in_stack_fffffffffffff908,in_stack_fffffffffffff910);
    }
    if ((local_40->is_grade_up & 1U) != 0) {
      duckdb::ListVector::Reserve(local_18,local_470);
      duckdb::ListVector::SetListSize(local_18,local_470);
      local_630 = ListVector::GetData((Vector *)in_stack_fffffffffffff7b8);
      memcpy(local_630,local_4c8,(long)local_20 << 4);
    }
    if (((byte)local_5fd.validity_mask & 1) != 0) {
      duckdb::GlobalSortState::AddLocalState((LocalSortState *)local_300);
      duckdb::GlobalSortState::PrepareMergePhase();
      SelectionVector::SelectionVector(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
      local_650 = 0;
      vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
      ::operator[]((vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
                    *)in_stack_fffffffffffff7c0,(size_type)in_stack_fffffffffffff7b8);
      unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::operator->
                ((unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true> *)
                 in_stack_fffffffffffff7c0);
      pSVar7 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
               operator*((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                          *)in_stack_fffffffffffff7c0);
      duckdb::PayloadScanner::PayloadScanner(local_668,pSVar7,local_300,true);
      do {
        duckdb::DataChunk::DataChunk(local_6a8);
        pvVar8 = (vector *)duckdb::Allocator::DefaultAllocator();
        duckdb::DataChunk::Initialize((Allocator *)local_6a8,pvVar8,(ulong)&local_40->payload_types)
        ;
        DataChunk::SetCardinality(local_6a8,0);
        duckdb::PayloadScanner::Scan((DataChunk *)local_668);
        iVar9 = DataChunk::size(local_6a8);
        if (iVar9 == 0) {
          bVar2 = true;
        }
        else {
          pvVar10 = vector<duckdb::Vector,_true>::operator[]
                              ((vector<duckdb::Vector,_true> *)in_stack_fffffffffffff7c0,
                               (size_type)in_stack_fffffffffffff7b8);
          duckdb::Vector::Vector((Vector *)&stack0xfffffffffffff8e8,pvVar10);
          FlatVector::GetData<unsigned_int>((Vector *)0xd5761a);
          iVar9 = DataChunk::size(local_6a8);
          for (uVar11 = 0; uVar11 < iVar9; uVar11 = uVar11 + 1) {
            SelectionVector::set_index
                      ((SelectionVector *)
                       CONCAT17(in_stack_fffffffffffff7d7,in_stack_fffffffffffff7d0),
                       (idx_t)in_stack_fffffffffffff7c8,(idx_t)in_stack_fffffffffffff7c0);
            local_650 = local_650 + 1;
          }
          Vector::~Vector((Vector *)in_stack_fffffffffffff7c0);
          bVar2 = false;
        }
        duckdb::DataChunk::~DataChunk(local_6a8);
      } while (!bVar2);
      if ((local_40->is_grade_up & 1U) == 0) {
        duckdb::Vector::Slice(local_478,(ulong)&local_648);
        duckdb::Vector::Flatten((ulong)local_478);
      }
      else {
        uVar11 = duckdb::ListVector::GetEntry(local_18);
        local_740 = ListVector::GetData((Vector *)in_stack_fffffffffffff7b8);
        for (local_748 = (UnifiedVectorFormat *)0x0; local_748 < local_20; local_748 = local_748 + 1
            ) {
          bVar2 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_fffffffffffff7c8,(idx_t)in_stack_fffffffffffff7c0);
          if (bVar2) {
            for (local_750 = (Value *)local_740[(long)local_748].offset;
                local_750 <
                (Value *)(local_740[(long)local_748].offset + local_740[(long)local_748].length);
                local_750 = local_750 + 1) {
              iVar9 = SelectionVector::get_index(&local_648,(idx_t)local_750);
              local_758 = iVar9 - local_740[(long)local_748].offset;
              pVVar12 = local_750;
              uVar13 = uVar11;
              UnsafeNumericCast<long,unsigned_long,void>(local_758 + 1);
              duckdb::Value::BIGINT((long)local_798);
              duckdb::Vector::SetValue(uVar11,pVVar12);
              duckdb::Value::~Value(local_798);
              uVar11 = uVar13;
            }
          }
        }
      }
      PayloadScanner::~PayloadScanner((PayloadScanner *)in_stack_fffffffffffff7c0);
      SelectionVector::~SelectionVector((SelectionVector *)0xd57972);
    }
    bVar3 = duckdb::DataChunk::AllConstant();
    if ((bVar3 & 1) != 0) {
      duckdb::Vector::SetVectorType((VectorType)local_18);
    }
    SelectionVector::~SelectionVector((SelectionVector *)0xd579d3);
    Vector::~Vector((Vector *)in_stack_fffffffffffff7c0);
    Vector::~Vector((Vector *)in_stack_fffffffffffff7c0);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffff7c0);
    Vector::~Vector((Vector *)in_stack_fffffffffffff7c0);
    LocalSortState::~LocalSortState((LocalSortState *)in_stack_fffffffffffff7c0);
    GlobalSortState::~GlobalSortState((GlobalSortState *)in_stack_fffffffffffff7c0);
  }
  return;
}

Assistant:

static void ListSortFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() >= 1 && args.ColumnCount() <= 3);
	auto count = args.size();
	Vector &input_lists = args.data[0];

	result.SetVectorType(VectorType::FLAT_VECTOR);
	auto &result_validity = FlatVector::Validity(result);

	if (input_lists.GetType().id() == LogicalTypeId::SQLNULL) {
		result_validity.SetInvalid(0);
		return;
	}

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<ListSortBindData>();

	// initialize the global and local sorting state
	auto &buffer_manager = BufferManager::GetBufferManager(info.context);
	GlobalSortState global_sort_state(info.context, info.orders, info.payload_layout);
	LocalSortState local_sort_state;
	local_sort_state.Initialize(global_sort_state, buffer_manager);

	Vector sort_result_vec = info.is_grade_up ? Vector(input_lists.GetType()) : result;

	// this ensures that we do not change the order of the entries in the input chunk
	VectorOperations::Copy(input_lists, sort_result_vec, count, 0, 0);

	// get the child vector
	auto lists_size = ListVector::GetListSize(sort_result_vec);
	auto &child_vector = ListVector::GetEntry(sort_result_vec);

	// get the lists data
	UnifiedVectorFormat lists_data;
	sort_result_vec.ToUnifiedFormat(count, lists_data);
	auto list_entries = UnifiedVectorFormat::GetData<list_entry_t>(lists_data);

	// create the lists_indices vector, this contains an element for each list's entry,
	// the element corresponds to the list's index, e.g. for [1, 2, 4], [5, 4]
	// lists_indices contains [0, 0, 0, 1, 1]
	Vector lists_indices(LogicalType::USMALLINT);
	auto lists_indices_data = FlatVector::GetData<uint16_t>(lists_indices);

	// create the payload_vector, this is just a vector containing incrementing integers
	// this will later be used as the 'new' selection vector of the child_vector, after
	// rearranging the payload according to the sorting order
	Vector payload_vector(LogicalType::UINTEGER);
	auto payload_vector_data = FlatVector::GetData<uint32_t>(payload_vector);

	// selection vector pointing to the data of the child vector,
	// used for slicing the child_vector correctly
	SelectionVector sel(STANDARD_VECTOR_SIZE);

	idx_t offset_lists_indices = 0;
	uint32_t incr_payload_count = 0;
	bool data_to_sort = false;

	for (idx_t i = 0; i < count; i++) {
		auto lists_index = lists_data.sel->get_index(i);
		const auto &list_entry = list_entries[lists_index];

		// nothing to do for this list
		if (!lists_data.validity.RowIsValid(lists_index)) {
			result_validity.SetInvalid(i);
			continue;
		}

		// empty list, no sorting required
		if (list_entry.length == 0) {
			continue;
		}

		for (idx_t child_idx = 0; child_idx < list_entry.length; child_idx++) {
			// lists_indices vector is full, sink
			if (offset_lists_indices == STANDARD_VECTOR_SIZE) {
				SinkDataChunk(&child_vector, sel, offset_lists_indices, info.types, info.payload_types, payload_vector,
				              local_sort_state, data_to_sort, lists_indices);
				offset_lists_indices = 0;
			}

			auto source_idx = list_entry.offset + child_idx;
			sel.set_index(offset_lists_indices, source_idx);
			lists_indices_data[offset_lists_indices] = UnsafeNumericCast<uint16_t>(i);
			payload_vector_data[offset_lists_indices] = NumericCast<uint32_t>(source_idx);
			offset_lists_indices++;
			incr_payload_count++;
		}
	}

	if (offset_lists_indices != 0) {
		SinkDataChunk(&child_vector, sel, offset_lists_indices, info.types, info.payload_types, payload_vector,
		              local_sort_state, data_to_sort, lists_indices);
	}

	if (info.is_grade_up) {
		ListVector::Reserve(result, lists_size);
		ListVector::SetListSize(result, lists_size);
		auto result_data = ListVector::GetData(result);
		memcpy(result_data, list_entries, count * sizeof(list_entry_t));
	}

	if (data_to_sort) {
		// add local state to global state, which sorts the data
		global_sort_state.AddLocalState(local_sort_state);
		global_sort_state.PrepareMergePhase();

		// selection vector that is to be filled with the 'sorted' payload
		SelectionVector sel_sorted(incr_payload_count);
		idx_t sel_sorted_idx = 0;

		// scan the sorted row data
		PayloadScanner scanner(*global_sort_state.sorted_blocks[0]->payload_data, global_sort_state);
		for (;;) {
			DataChunk result_chunk;
			result_chunk.Initialize(Allocator::DefaultAllocator(), info.payload_types);
			result_chunk.SetCardinality(0);
			scanner.Scan(result_chunk);
			if (result_chunk.size() == 0) {
				break;
			}

			// construct the selection vector with the new order from the result vectors
			Vector result_vector(result_chunk.data[0]);
			auto result_data = FlatVector::GetData<uint32_t>(result_vector);
			auto row_count = result_chunk.size();

			for (idx_t i = 0; i < row_count; i++) {
				sel_sorted.set_index(sel_sorted_idx, result_data[i]);
				D_ASSERT(result_data[i] < lists_size);
				sel_sorted_idx++;
			}
		}

		D_ASSERT(sel_sorted_idx == incr_payload_count);
		if (info.is_grade_up) {
			auto &result_entry = ListVector::GetEntry(result);
			auto result_data = ListVector::GetData(result);
			for (idx_t i = 0; i < count; i++) {
				if (!result_validity.RowIsValid(i)) {
					continue;
				}
				for (idx_t j = result_data[i].offset; j < result_data[i].offset + result_data[i].length; j++) {
					auto b = sel_sorted.get_index(j) - result_data[i].offset;
					result_entry.SetValue(j, Value::BIGINT(UnsafeNumericCast<int64_t>(b + 1)));
				}
			}
		} else {
			child_vector.Slice(sel_sorted, sel_sorted_idx);
			child_vector.Flatten(sel_sorted_idx);
		}
	}

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}